

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderAdjacencyTests.cpp
# Opt level: O0

void __thiscall
glcts::GeometryShaderAdjacencyTests::configureTestDataLines
          (GeometryShaderAdjacencyTests *this,AdjacencyTestData *test_data,bool withGS,bool indiced)

{
  char *local_30;
  bool indiced_local;
  bool withGS_local;
  AdjacencyTestData *test_data_local;
  GeometryShaderAdjacencyTests *this_local;
  
  if (withGS) {
    local_30 = configureTestDataLines::gsCode;
  }
  else {
    local_30 = (char *)0x0;
  }
  test_data->m_gs_code = local_30;
  test_data->m_mode = 10;
  test_data->m_tf_mode = 1;
  createGrid(this,test_data);
  if (indiced) {
    setLinePointsindiced(this,test_data);
  }
  else {
    setLinePointsNonindiced(this,test_data);
  }
  return;
}

Assistant:

void GeometryShaderAdjacencyTests::configureTestDataLines(AdjacencyTestData& test_data, bool withGS, bool indiced)
{
	static const char* gsCode = "${VERSION}\n"
								"\n"
								"${GEOMETRY_SHADER_REQUIRE}\n"
								"\n"
								"precision highp float;\n"
								"\n"
								"layout(lines_adjacency)            in;\n"
								"layout(line_strip, max_vertices=2) out;\n"
								"\n"
								"layout(location = 0) out vec4 out_adjacent_geometry;\n"
								"layout(location = 1) out vec4 out_geometry;\n"
								"\n"
								"void main()\n"
								"{\n"
								"    out_adjacent_geometry = gl_in[0].gl_Position;\n"
								"    out_geometry          = gl_in[1].gl_Position;\n"
								"    EmitVertex();\n"
								"    out_adjacent_geometry = gl_in[3].gl_Position;\n"
								"    out_geometry          = gl_in[2].gl_Position;\n"
								"    EmitVertex();\n"
								"    EndPrimitive();\n"
								"}\n";

	test_data.m_gs_code = (withGS) ? gsCode : 0;
	test_data.m_mode	= GL_LINES_ADJACENCY_EXT;
	test_data.m_tf_mode = GL_LINES;

	createGrid(test_data);

	if (indiced)
	{
		setLinePointsindiced(test_data);
	}
	else
	{
		setLinePointsNonindiced(test_data);
	}
}